

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O1

void h2v1_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                  JSAMPARRAY *output_data_ptr)

{
  JSAMPROW pJVar1;
  JSAMPLE JVar2;
  uint uVar3;
  JSAMPARRAY ppJVar4;
  JSAMPROW pJVar5;
  JSAMPROW pJVar6;
  long lVar7;
  long lVar8;
  
  if (0 < cinfo->max_v_samp_factor) {
    ppJVar4 = *output_data_ptr;
    lVar7 = 0;
    do {
      uVar3 = cinfo->output_width;
      if ((ulong)uVar3 != 0) {
        pJVar5 = ppJVar4[lVar7];
        pJVar6 = input_data[lVar7];
        lVar8 = 0;
        do {
          JVar2 = pJVar6[lVar8];
          pJVar1 = pJVar5 + lVar8 * 2;
          *pJVar1 = JVar2;
          pJVar1[1] = JVar2;
          lVar8 = lVar8 + 1;
        } while (pJVar1 + 2 < pJVar5 + uVar3);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_upsample (j_decompress_ptr cinfo, jpeg_component_info * compptr,
	       JSAMPARRAY input_data, JSAMPARRAY * output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  JSAMPROW outend;
  int outrow;

  for (outrow = 0; outrow < cinfo->max_v_samp_factor; outrow++) {
    inptr = input_data[outrow];
    outptr = output_data[outrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;	/* don't need GETJSAMPLE() here */
      *outptr++ = invalue;
      *outptr++ = invalue;
    }
  }
}